

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

string * efsw::FileSystem::getLinkRealPath
                   (string *__return_storage_ptr__,string *dir,string *curPath)

{
  bool bVar1;
  string sStack_a8;
  string local_88;
  FileInfo fi;
  
  dirRemoveSlashAtEnd(dir);
  FileInfo::FileInfo(&fi,dir,true);
  bVar1 = FileInfo::isLink(&fi);
  if (bVar1) {
    FileInfo::linksTo_abi_cxx11_(__return_storage_ptr__,&fi);
    std::__cxx11::string::string((string *)&sStack_a8,(string *)dir);
    pathRemoveFileName(&local_88,&sStack_a8);
    std::__cxx11::string::operator=((string *)curPath,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&sStack_a8);
    dirAddSlashAtEnd(__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_88);
  }
  std::__cxx11::string::~string((string *)&fi);
  return __return_storage_ptr__;
}

Assistant:

std::string FileSystem::getLinkRealPath( std::string dir, std::string& curPath ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	FileInfo fi( dir, true );

	/// Check with lstat and see if it's a link
	if ( fi.isLink() ) {
		/// get the real path of the link
		std::string link( fi.linksTo() );

		/// get the current path of the directory without the link dir path
		curPath = FileSystem::pathRemoveFileName( dir );

		/// ensure that ends with the os directory slash
		FileSystem::dirAddSlashAtEnd( link );

		return link;
	}

	/// if it's not a link return nothing
	return "";
}